

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O3

bool isValidHttpHeaderNameField(QAnyStringView name)

{
  bool bVar1;
  QLatin1StringView name_00;
  
  if (((undefined1  [16])name & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0) {
    lcQHttpHeaders();
    if (((byte)lcQHttpHeaders::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0
       ) {
      isValidHttpHeaderNameField();
    }
  }
  else {
    name_00.m_data = name.field_0.m_data_utf8;
    name_00.m_size = name.m_size & 0x3fffffffffffffff;
    bVar1 = headerNameValidImpl(name_00);
    if (bVar1) {
      return true;
    }
    lcQHttpHeaders();
    if (((byte)lcQHttpHeaders::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0
       ) {
      isValidHttpHeaderNameField();
    }
  }
  return false;
}

Assistant:

static bool isValidHttpHeaderNameField(QAnyStringView name) noexcept
{
    if (name.isEmpty()) {
        qCWarning(lcQHttpHeaders, "HTTP header name cannot be empty");
        return false;
    }
    const bool valid = name.visit([](auto name){ return headerNameValidImpl(name); });
    if (!valid)
        qCWarning(lcQHttpHeaders, "HTTP header name contained illegal character(s)");
    return valid;
}